

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<unsigned_long>,unsigned_long,duckdb::BitXorOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  VectorType VVar1;
  bool bVar2;
  ValidityMask *input_mask_p;
  UnifiedVectorFormat *in_RCX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  UnifiedVectorFormat idata_2;
  unsigned_long *idata_1;
  AggregateUnaryInput input_data;
  unsigned_long *idata;
  idx_t in_stack_ffffffffffffff28;
  AggregateUnaryInput *in_stack_ffffffffffffff30;
  UnifiedVectorFormat *this;
  unsigned_long *in_stack_ffffffffffffff38;
  BitState<unsigned_long> *in_stack_ffffffffffffff40;
  SelectionVector *in_stack_ffffffffffffff48;
  ValidityMask *in_stack_ffffffffffffff50;
  idx_t in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff64;
  AggregateInputData *in_stack_ffffffffffffff68;
  ValidityMask *in_stack_ffffffffffffff70;
  idx_t in_stack_ffffffffffffff78;
  BitState<unsigned_long> *in_stack_ffffffffffffff80;
  AggregateInputData *in_stack_ffffffffffffff88;
  unsigned_long *in_stack_ffffffffffffff90;
  AggregateUnaryInput local_40;
  unsigned_long *local_28;
  UnifiedVectorFormat *local_20;
  AggregateInputData *local_10;
  Vector *local_8;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  uVar3 = CONCAT13(VVar1,(int3)in_stack_ffffffffffffff60);
  if (VVar1 == FLAT_VECTOR) {
    FlatVector::GetData<unsigned_long>((Vector *)0x991790);
    FlatVector::Validity((Vector *)0x9917d9);
    UnaryFlatUpdateLoop<duckdb::BitState<unsigned_long>,unsigned_long,duckdb::BitXorOperation>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    bVar2 = BitwiseOperation::IgnoreNull();
    if ((!bVar2) || (bVar2 = ConstantVector::IsNull((Vector *)0x99170a), !bVar2)) {
      local_28 = ConstantVector::GetData<unsigned_long>((Vector *)0x991722);
      input_mask_p = ConstantVector::Validity(local_8);
      AggregateUnaryInput::AggregateUnaryInput(&local_40,local_10,input_mask_p);
      BitXorOperation::
      ConstantOperation<unsigned_long,duckdb::BitState<unsigned_long>,duckdb::BitXorOperation>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
    }
  }
  else {
    this = (UnifiedVectorFormat *)&stack0xffffffffffffff70;
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this);
    duckdb::Vector::ToUnifiedFormat((ulong)local_8,local_20);
    UnifiedVectorFormat::GetData<unsigned_long>((UnifiedVectorFormat *)&stack0xffffffffffffff70);
    UnaryUpdateLoop<duckdb::BitState<unsigned_long>,unsigned_long,duckdb::BitXorOperation>
              ((unsigned_long *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (BitState<unsigned_long> *)CONCAT44(in_stack_ffffffffffffff64,uVar3),
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    UnifiedVectorFormat::~UnifiedVectorFormat(this);
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}